

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c++
# Opt level: O2

void __thiscall kj::Thread::sendSignal(Thread *this,int signo)

{
  int osErrorNumber;
  Fault f;
  
  osErrorNumber = pthread_kill(this->threadId,signo);
  if (osErrorNumber != 0) {
    _::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/thread.c++"
               ,0x71,osErrorNumber,"pthread_kill","");
    _::Debug::Fault::~Fault(&f);
  }
  return;
}

Assistant:

void Thread::sendSignal(int signo) {
  int pthreadResult = pthread_kill(*reinterpret_cast<pthread_t*>(&threadId), signo);
  if (pthreadResult != 0) {
    KJ_FAIL_SYSCALL("pthread_kill", pthreadResult) { break; }
  }
}